

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::TypeParameterDeclarationSyntax::setChild
          (TypeParameterDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *pSVar8;
  logic_error *this_00;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar8 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>>
                       (*ppSVar7);
    (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->declarators).super_SyntaxListBase.childCount = (pSVar8->super_SyntaxListBase).childCount;
    sVar2 = (pSVar8->elements).size_;
    (this->declarators).elements.data_ = (pSVar8->elements).data_;
    (this->declarators).elements.size_ = sVar2;
  }
  else if (index == 1) {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->typeKeyword).kind = pvVar6->kind;
    (this->typeKeyword).field_0x2 = uVar3;
    (this->typeKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->typeKeyword).rawLen = uVar5;
    (this->typeKeyword).info = pIVar1;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar10) {
        local_b0.field_2._M_allocated_capacity = *psVar10;
        local_b0.field_2._8_8_ = plVar9[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar10;
      }
      local_b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x32e9);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar9;
      plVar11 = plVar9 + 2;
      if (local_90 == plVar11) {
        local_80 = *plVar11;
        lStack_78 = plVar9[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar11;
      }
      local_88 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar9;
      plVar11 = plVar9 + 2;
      if (local_f0 == plVar11) {
        local_e0 = *plVar11;
        lStack_d8 = plVar9[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar11;
      }
      local_e8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->super_ParameterDeclarationBaseSyntax).keyword.kind = pvVar6->kind;
    (this->super_ParameterDeclarationBaseSyntax).keyword.field_0x2 = uVar3;
    (this->super_ParameterDeclarationBaseSyntax).keyword.numFlags = (NumericTokenFlags)NVar4.raw;
    (this->super_ParameterDeclarationBaseSyntax).keyword.rawLen = uVar5;
    (this->super_ParameterDeclarationBaseSyntax).keyword.info = pIVar1;
  }
  return;
}

Assistant:

void TypeParameterDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: typeKeyword = child.token(); return;
        case 2: declarators = child.node()->as<SeparatedSyntaxList<TypeAssignmentSyntax>>(); return;
        default: ASSUME_UNREACHABLE;
    }
}